

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.h
# Opt level: O1

R_conflict12 __thiscall
QtPrivate::
q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
::operator()(q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
             *this,char16_t *first,char16_t *last,char *pat_first,char *pat_last)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  ulong uVar8;
  char16_t *pcVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  R_conflict12 RVar13;
  
  uVar8 = (long)pat_last - (long)pat_first;
  pcVar5 = first;
  pcVar7 = first;
  if (uVar8 != 0) {
    pcVar9 = first + (uVar8 - 1);
    pcVar6 = first;
    do {
      pcVar5 = last;
      pcVar7 = last;
      if (last <= pcVar9) break;
      uVar12 = (ulong)(byte)this[(byte)*pcVar9];
      if (uVar12 == 0) {
        if ((long)uVar8 < 1) {
          uVar10 = 0;
        }
        else {
          if (pat_first[uVar8 - 1] == (byte)*pcVar9) {
            pcVar11 = (char *)0x0;
            do {
              uVar10 = uVar8;
              if (pat_first + (1 - (long)pat_last) == pcVar11) goto LAB_0030d64a;
              pcVar3 = pcVar11 + -2;
              pcVar1 = pcVar11 + -1;
              pcVar4 = pcVar11 + -1;
              pcVar11 = pcVar1;
            } while (pat_last[(long)pcVar3] == (byte)pcVar9[(long)pcVar4]);
            uVar10 = -(long)pcVar1;
            bVar2 = (long)uVar10 < (long)uVar8;
          }
          else {
            uVar10 = 0;
            bVar2 = 0 < (long)uVar8;
          }
          if (bVar2) {
            uVar12 = uVar8 - uVar10;
            if (uVar8 != (byte)this[(byte)pcVar9[-uVar10]]) {
              uVar12 = 1;
            }
            goto LAB_0030d5d9;
          }
        }
LAB_0030d64a:
        pcVar6 = pcVar9 + ((uVar8 + 1) - uVar10);
        first = pcVar9 + (1 - uVar10);
        bVar2 = false;
      }
      else {
LAB_0030d5d9:
        pcVar9 = pcVar9 + uVar12;
        bVar2 = true;
      }
      pcVar5 = first;
      pcVar7 = pcVar6;
    } while (bVar2);
  }
  RVar13.end = pcVar7;
  RVar13.begin = pcVar5;
  return RVar13;
}

Assistant:

constexpr auto operator()(RandomIt2 first, RandomIt2 last, RandomIt1 pat_first,
                              RandomIt1 pat_last) const
    {
        struct R
        {
            RandomIt2 begin, end;
        };
        Hash hf;
        BinaryPredicate pred;
        auto pat_length = std::distance(pat_first, pat_last);
        if (pat_length == 0)
            return R{ first, first };

        const qsizetype pl_minus_one = qsizetype(pat_length - 1);
        RandomIt2 current = first + pl_minus_one;

        while (current < last) {
            qsizetype skip = m_skiptable[hf(*current)];
            if (!skip) {
                // possible match
                while (skip < pat_length) {
                    if (!pred(hf(*(current - skip)), uchar(pat_first[pl_minus_one - skip])))
                        break;
                    skip++;
                }
                if (skip > pl_minus_one) { // we have a match
                    auto match = current - skip + 1;
                    return R{ match, match + pat_length };
                }

                // If we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (m_skiptable[hf(*(current - skip))] == pat_length)
                    skip = pat_length - skip;
                else
                    skip = 1;
            }
            current += skip;
        }

        return R{ last, last };
    }